

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O1

int lj_cf_debug_gethook(lua_State *L)

{
  byte bVar1;
  code *pcVar2;
  TValue *pTVar3;
  uint uVar4;
  ulong uVar5;
  cTValue *pcVar6;
  bool bVar7;
  char buff [5];
  char local_1d [5];
  
  uVar5 = (ulong)(L->glref).ptr32;
  bVar1 = *(byte *)(uVar5 + 0x91);
  pcVar2 = *(code **)(uVar5 + 0xd0);
  if (pcVar2 == hookf || pcVar2 == (code *)0x0) {
    lua_pushlightuserdata(L,"h");
    pTVar3 = L->top;
    pcVar6 = lj_tab_get(L,(GCtab *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x98),pTVar3 + -1);
    pTVar3[-1] = *pcVar6;
  }
  else {
    lua_pushlstring(L,"external hook",0xd);
  }
  bVar7 = (bVar1 & 1) != 0;
  if (bVar7) {
    local_1d[0] = 'c';
  }
  uVar4 = (uint)bVar7;
  if ((bVar1 & 2) != 0) {
    uVar5 = (ulong)uVar4;
    uVar4 = uVar4 + 1;
    local_1d[uVar5] = 'r';
  }
  if ((bVar1 & 4) != 0) {
    uVar5 = (ulong)uVar4;
    uVar4 = uVar4 + 1;
    local_1d[uVar5] = 'l';
  }
  local_1d[uVar4] = '\0';
  lua_pushstring(L,local_1d);
  L->top->n = (double)*(int *)((ulong)(L->glref).ptr32 + 0xcc);
  pTVar3 = L->top;
  L->top = pTVar3 + 1;
  if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar3 + 1) {
    lj_state_growstack(L,1);
  }
  return 3;
}

Assistant:

LJLIB_CF(debug_gethook)
{
  char buff[5];
  int mask = lua_gethookmask(L);
  lua_Hook hook = lua_gethook(L);
  if (hook != NULL && hook != hookf) {  /* external hook? */
    lua_pushliteral(L, "external hook");
  } else {
    lua_pushlightuserdata(L, (void *)&KEY_HOOK);
    lua_rawget(L, LUA_REGISTRYINDEX);   /* get hook */
  }
  lua_pushstring(L, unmakemask(mask, buff));
  lua_pushinteger(L, lua_gethookcount(L));
  return 3;
}